

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.h
# Opt level: O2

int can_ipv6(void)

{
  int iVar1;
  anon_union_28_2_e90107a3_for_address *paVar2;
  long lVar3;
  uint uVar4;
  int count;
  uv_interface_address_t *addr;
  int local_14;
  uv_interface_address_t *local_10;
  
  iVar1 = uv_interface_addresses(&local_10,&local_14);
  uVar4 = 0;
  if (iVar1 == 0) {
    paVar2 = &local_10->address;
    uVar4 = 0;
    for (lVar3 = 0; (uVar4 == 0 && (lVar3 < local_14)); lVar3 = lVar3 + 1) {
      uVar4 = (uint)((paVar2->address4).sin_family == 10);
      paVar2 = (anon_union_28_2_e90107a3_for_address *)((long)paVar2 + 0x50);
    }
    uv_free_interface_addresses(local_10,local_14);
  }
  return uVar4;
}

Assistant:

UNUSED static int can_ipv6(void) {
  uv_interface_address_t* addr;
  int supported;
  int count;
  int i;

  if (uv_interface_addresses(&addr, &count))
    return 0;  /* Assume no IPv6 support on failure. */

  supported = 0;
  for (i = 0; supported == 0 && i < count; i += 1)
    supported = (AF_INET6 == addr[i].address.address6.sin6_family);

  uv_free_interface_addresses(addr, count);
  return supported;
}